

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void musig_tweak_test_helper
               (secp256k1_xonly_pubkey *agg_pk,uchar *sk0,uchar *sk1,
               secp256k1_musig_keyagg_cache *keyagg_cache)

{
  int iVar1;
  int i;
  uchar final_sig [64];
  secp256k1_musig_partial_sig *partial_sig_ptr [2];
  secp256k1_musig_partial_sig partial_sig [2];
  secp256k1_musig_session session;
  secp256k1_keypair keypair [2];
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_musig_pubnonce *pubnonce_ptr [2];
  secp256k1_musig_pubnonce pubnonce [2];
  secp256k1_musig_secnonce secnonce [2];
  uchar msg [32];
  uchar session_secrand [2] [32];
  secp256k1_pubkey pk [2];
  uchar *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa50;
  int iVar2;
  uchar *in_stack_fffffffffffffa58;
  uchar *in_stack_fffffffffffffa60;
  secp256k1_musig_pubnonce *in_stack_fffffffffffffa68;
  secp256k1_musig_secnonce *in_stack_fffffffffffffa70;
  secp256k1_context *in_stack_fffffffffffffa78;
  uchar *in_stack_fffffffffffffa90;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffa98;
  uchar *in_stack_fffffffffffffaa0;
  secp256k1_pubkey *in_stack_fffffffffffffaa8;
  secp256k1_keypair *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffae8;
  secp256k1_musig_partial_sig **in_stack_fffffffffffffaf0;
  secp256k1_musig_session *in_stack_fffffffffffffaf8;
  uchar *in_stack_fffffffffffffb00;
  secp256k1_context *in_stack_fffffffffffffb08;
  size_t in_stack_fffffffffffffc30;
  secp256k1_musig_pubnonce **in_stack_fffffffffffffc38;
  secp256k1_musig_aggnonce *in_stack_fffffffffffffc40;
  secp256k1_context *in_stack_fffffffffffffc48;
  long local_338 [2];
  secp256k1_xonly_pubkey *in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  uchar *in_stack_fffffffffffffce8;
  uchar *in_stack_fffffffffffffcf0;
  secp256k1_context *in_stack_fffffffffffffcf8;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffd08;
  uchar *in_stack_fffffffffffffd10;
  secp256k1_musig_aggnonce *in_stack_fffffffffffffd18;
  secp256k1_musig_session *in_stack_fffffffffffffd20;
  secp256k1_context *in_stack_fffffffffffffd28;
  secp256k1_musig_session *in_stack_fffffffffffffd50;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffd58;
  secp256k1_keypair *in_stack_fffffffffffffd60;
  secp256k1_musig_secnonce *in_stack_fffffffffffffd68;
  secp256k1_musig_partial_sig *in_stack_fffffffffffffd70;
  secp256k1_context *in_stack_fffffffffffffd78;
  secp256k1_musig_session *in_stack_ffffffffffffff40;
  secp256k1_musig_keyagg_cache *in_stack_ffffffffffffff48;
  secp256k1_pubkey *in_stack_ffffffffffffff50;
  secp256k1_musig_pubnonce *in_stack_ffffffffffffff58;
  secp256k1_musig_partial_sig *in_stack_ffffffffffffff60;
  secp256k1_context *in_stack_ffffffffffffff68;
  
  for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
    local_338[iVar2] = (long)(&stack0xfffffffffffffcd8 + (long)iVar2 * 0x84);
    *(undefined1 **)(&stack0xfffffffffffffa98 + (long)iVar2 * 8) =
         &stack0xfffffffffffffaa8 + (long)iVar2 * 0x24;
    testrand256(in_stack_fffffffffffffa40);
  }
  iVar1 = create_keypair_and_pk
                    (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x263,"test condition failed: create_keypair_and_pk(&keypair[0], &pk[0], sk0) == 1");
    abort();
  }
  iVar1 = create_keypair_and_pk
                    (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x264,"test condition failed: create_keypair_and_pk(&keypair[1], &pk[1], sk1) == 1");
    abort();
  }
  testrand256(in_stack_fffffffffffffa40);
  iVar1 = secp256k1_musig_nonce_gen
                    (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                     in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                     (secp256k1_pubkey *)CONCAT44(iVar2,in_stack_fffffffffffffa50),
                     in_stack_fffffffffffffa90,in_stack_fffffffffffffa98,in_stack_fffffffffffffaa0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x267,
            "test condition failed: secp256k1_musig_nonce_gen(CTX, &secnonce[0], &pubnonce[0], session_secrand[0], sk0, &pk[0], NULL, NULL, NULL) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_nonce_gen
                    (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                     in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                     (secp256k1_pubkey *)CONCAT44(iVar2,in_stack_fffffffffffffa50),
                     in_stack_fffffffffffffa90,in_stack_fffffffffffffa98,in_stack_fffffffffffffaa0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x268,
            "test condition failed: secp256k1_musig_nonce_gen(CTX, &secnonce[1], &pubnonce[1], session_secrand[1], sk1, &pk[1], NULL, NULL, NULL) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_nonce_agg
                    (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     in_stack_fffffffffffffc30);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x26a,
            "test condition failed: secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_nonce_process
                    (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x26b,
            "test condition failed: secp256k1_musig_nonce_process(CTX, &session, &aggnonce, msg, keyagg_cache) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_partial_sign
                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x26d,
            "test condition failed: secp256k1_musig_partial_sign(CTX, &partial_sig[0], &secnonce[0], &keypair[0], keyagg_cache, &session) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_partial_sign
                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x26e,
            "test condition failed: secp256k1_musig_partial_sign(CTX, &partial_sig[1], &secnonce[1], &keypair[1], keyagg_cache, &session) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_partial_sig_verify
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x270,
            "test condition failed: secp256k1_musig_partial_sig_verify(CTX, &partial_sig[0], &pubnonce[0], &pk[0], keyagg_cache, &session) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_partial_sig_verify
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x271,
            "test condition failed: secp256k1_musig_partial_sig_verify(CTX, &partial_sig[1], &pubnonce[1], &pk[1], keyagg_cache, &session) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_musig_partial_sig_agg
                    (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                     in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x273,
            "test condition failed: secp256k1_musig_partial_sig_agg(CTX, final_sig, &session, partial_sig_ptr, 2) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_schnorrsig_verify
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x274,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, final_sig, msg, sizeof(msg), agg_pk) == 1"
           );
    abort();
  }
  return;
}

Assistant:

static void musig_tweak_test_helper(const secp256k1_xonly_pubkey* agg_pk, const unsigned char *sk0, const unsigned char *sk1, secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_pubkey pk[2];
    unsigned char session_secrand[2][32];
    unsigned char msg[32];
    secp256k1_musig_secnonce secnonce[2];
    secp256k1_musig_pubnonce pubnonce[2];
    const secp256k1_musig_pubnonce *pubnonce_ptr[2];
    secp256k1_musig_aggnonce aggnonce;
    secp256k1_keypair keypair[2];
    secp256k1_musig_session session;
    secp256k1_musig_partial_sig partial_sig[2];
    const secp256k1_musig_partial_sig *partial_sig_ptr[2];
    unsigned char final_sig[64];
    int i;

    for (i = 0; i < 2; i++) {
        pubnonce_ptr[i] = &pubnonce[i];
        partial_sig_ptr[i] = &partial_sig[i];

        testrand256(session_secrand[i]);
    }
    CHECK(create_keypair_and_pk(&keypair[0], &pk[0], sk0) == 1);
    CHECK(create_keypair_and_pk(&keypair[1], &pk[1], sk1) == 1);
    testrand256(msg);

    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[0], &pubnonce[0], session_secrand[0], sk0, &pk[0], NULL, NULL, NULL) == 1);
    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[1], &pubnonce[1], session_secrand[1], sk1, &pk[1], NULL, NULL, NULL) == 1);

    CHECK(secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2) == 1);
    CHECK(secp256k1_musig_nonce_process(CTX, &session, &aggnonce, msg, keyagg_cache) == 1);

    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[0], &secnonce[0], &keypair[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[1], &secnonce[1], &keypair[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[0], &pubnonce[0], &pk[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[1], &pubnonce[1], &pk[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_agg(CTX, final_sig, &session, partial_sig_ptr, 2) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, final_sig, msg, sizeof(msg), agg_pk) == 1);
}